

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint bit,Adaptive_Bit_Model *M)

{
  uint *puVar1;
  uchar *puVar2;
  uint uVar3;
  uchar uVar4;
  uchar *puVar5;
  uint uVar6;
  
  uVar6 = (this->length >> 0xd) * M->bit_0_prob;
  if (bit == 0) {
    this->length = uVar6;
    M->bit_0_count = M->bit_0_count + 1;
  }
  else {
    puVar1 = &this->base;
    uVar3 = *puVar1;
    *puVar1 = *puVar1 + uVar6;
    this->length = this->length - uVar6;
    if (CARRY4(uVar3,uVar6)) {
      puVar5 = this->ac_pointer;
      while( true ) {
        puVar2 = puVar5 + -1;
        puVar5 = puVar5 + -1;
        if (*puVar2 != 0xff) break;
        *puVar5 = '\0';
      }
      *puVar5 = *puVar2 + '\x01';
    }
  }
  uVar6 = this->length;
  while (uVar6 < 0x1000000) {
    uVar4 = *(uchar *)((long)&this->base + 3);
    puVar5 = this->ac_pointer;
    this->ac_pointer = puVar5 + 1;
    *puVar5 = uVar4;
    this->base = this->base << 8;
    uVar6 = this->length << 8;
    this->length = uVar6;
  }
  puVar1 = &M->bits_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    Adaptive_Bit_Model::update(M);
    return;
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned bit,
                                  Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        unsigned init_base = base;
        base   += x;
        length -= x;
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update
    }